

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pad-reflect-1d.cpp
# Opt level: O2

void check_tensor(ggml_tensor *t,float *expected_t_d,int ne0,int ne1,int ne2)

{
  undefined8 uVar1;
  float *pfVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  undefined8 uStack_80;
  undefined1 auStack_78 [12];
  float local_6c;
  float local_68;
  int local_64;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  float *local_40;
  ulong local_38;
  
  puVar7 = (undefined8 *)auStack_78;
  local_40 = expected_t_d;
  if (t->type != GGML_TYPE_F32) goto LAB_0010149f;
  local_60 = t->ne[0];
  if (local_60 == ne0) {
    if (t->ne[1] == (long)ne1) {
      if (t->ne[2] == (long)ne2) {
        local_48 = 0;
        uVar10 = 0;
        if (0 < ne0) {
          uVar10 = (ulong)(uint)ne0;
        }
        local_38 = 0;
        if (0 < ne1) {
          local_38 = (ulong)(uint)ne1;
        }
        local_50 = (ulong)(uint)ne2;
        if (ne2 < 1) {
          local_50 = local_48;
        }
        local_64 = ne1 * ne0;
        local_60 = local_60 << 2;
        local_58 = 0;
        do {
          if (local_58 == local_50) {
            return;
          }
          lVar9 = (long)(int)local_48 << 2;
          for (uVar5 = 0; pfVar2 = local_40, uVar5 != local_38; uVar5 = uVar5 + 1) {
            uVar8 = 0;
            while (uVar10 != uVar8) {
              local_6c = *(float *)((long)pfVar2 + uVar8 * 4 + lVar9);
              uStack_80 = 0x1013f3;
              lVar3 = ggml_get_data_f32(t);
              fVar11 = *(float *)(lVar3 + lVar9 + uVar8 * 4);
              if ((local_6c != fVar11) || (NAN(local_6c) || NAN(fVar11))) {
                uStack_80 = 0x101431;
                local_68 = fVar11;
                printf("expected %.1f, got %.1f at (%d,%d,%d)\n",(double)local_6c,(double)fVar11,
                       uVar8 & 0xffffffff,uVar5 & 0xffffffff,local_58);
                fVar11 = local_68;
              }
              uVar8 = uVar8 + 1;
              if ((local_6c != fVar11) || (NAN(local_6c) || NAN(fVar11))) {
                pcVar4 = "expected == actual";
                puVar6 = &uStack_80;
                uStack_80 = 0x30;
                goto LAB_00101497;
              }
            }
            lVar9 = lVar9 + local_60;
          }
          local_58 = local_58 + 1;
          local_48 = (ulong)(uint)((int)local_48 + local_64);
        } while( true );
      }
      pcVar4 = "t->ne[2] == ne2";
      puVar6 = &uStack_80;
      uStack_80 = 0x27;
    }
    else {
      pcVar4 = "t->ne[1] == ne1";
      puVar6 = &uStack_80;
      uStack_80 = 0x26;
    }
  }
  else {
    pcVar4 = "t->ne[0] == ne0";
    puVar6 = &uStack_80;
    uStack_80 = 0x25;
  }
LAB_00101497:
  do {
    uVar1 = *puVar6;
    puVar7 = puVar6 + 1;
    *puVar6 = 0x10149f;
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-pad-reflect-1d.cpp"
               ,uVar1,"GGML_ASSERT(%s) failed",pcVar4);
LAB_0010149f:
    pcVar4 = "t->type == GGML_TYPE_F32";
    puVar6 = (undefined8 *)((long)puVar7 + -8);
    *(undefined8 *)((long)puVar7 + -8) = 0x24;
  } while( true );
}

Assistant:

void check_tensor(struct ggml_tensor * t, float * expected_t_d, int ne0, int ne1, int ne2) {
    GGML_ASSERT(t->type == GGML_TYPE_F32);
    GGML_ASSERT(t->ne[0] == ne0);
    GGML_ASSERT(t->ne[1] == ne1);
    GGML_ASSERT(t->ne[2] == ne2);
    for (int i2 = 0; i2 < ne2; ++i2) {
        for (int i1 = 0; i1 < ne1; ++i1) {
            for (int i0 = 0; i0 < ne0; ++i0) {
                float expected = *(expected_t_d + i2 * ne1 * ne0 + i1 * ne0 + i0);
                float actual = ggml_get_data_f32(t)[i2 * ne1 * ne0 + i1 * ne0 + i0];
                if (expected != actual) {
                    printf("expected %.1f, got %.1f at (%d,%d,%d)\n", expected, actual, i0, i1, i2);
                }
                GGML_ASSERT(expected == actual);
            }
        }
    }
}